

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

RtreeSearchPoint * rtreeEnqueue(RtreeCursor *pCur,RtreeDValue rScore,u8 iLevel)

{
  int i_00;
  int iVar1;
  void *pvVar2;
  RtreeSearchPoint *pB;
  undefined1 in_SIL;
  long in_RDI;
  RtreeDValue in_XMM0_Qa;
  RtreeSearchPoint *pParent;
  int nNew;
  RtreeSearchPoint *pNew;
  int j;
  int i;
  void *in_stack_ffffffffffffffb8;
  RtreeSearchPoint *local_30;
  int in_stack_ffffffffffffffd8;
  int iVar3;
  undefined3 in_stack_ffffffffffffffe4;
  undefined4 uVar4;
  
  uVar4 = CONCAT13(in_SIL,in_stack_ffffffffffffffe4);
  if (*(int *)(in_RDI + 0x20) <= *(int *)(in_RDI + 0x24)) {
    iVar3 = *(int *)(in_RDI + 0x20);
    pvVar2 = sqlite3_realloc(in_stack_ffffffffffffffb8,0);
    if (pvVar2 == (void *)0x0) {
      return (RtreeSearchPoint *)0x0;
    }
    *(void **)(in_RDI + 0x30) = pvVar2;
    *(int *)(in_RDI + 0x20) = iVar3 * 2 + 8;
  }
  iVar3 = *(int *)(in_RDI + 0x24);
  *(int *)(in_RDI + 0x24) = iVar3 + 1;
  local_30 = (RtreeSearchPoint *)(*(long *)(in_RDI + 0x30) + (long)iVar3 * 0x18);
  local_30->rScore = in_XMM0_Qa;
  local_30->iLevel = (u8)((uint)uVar4 >> 0x18);
  while( true ) {
    if (iVar3 < 1) {
      return local_30;
    }
    i_00 = (iVar3 + -1) / 2;
    pB = (RtreeSearchPoint *)(*(long *)(in_RDI + 0x30) + (long)i_00 * 0x18);
    iVar1 = rtreeSearchPointCompare(local_30,pB);
    if (-1 < iVar1) break;
    rtreeSearchPointSwap((RtreeCursor *)CONCAT44(uVar4,iVar3),i_00,in_stack_ffffffffffffffd8);
    local_30 = pB;
    iVar3 = i_00;
  }
  return local_30;
}

Assistant:

static RtreeSearchPoint *rtreeEnqueue(
  RtreeCursor *pCur,    /* The cursor */
  RtreeDValue rScore,   /* Score for the new search point */
  u8 iLevel             /* Level for the new search point */
){
  int i, j;
  RtreeSearchPoint *pNew;
  if( pCur->nPoint>=pCur->nPointAlloc ){
    int nNew = pCur->nPointAlloc*2 + 8;
    pNew = sqlite3_realloc(pCur->aPoint, nNew*sizeof(pCur->aPoint[0]));
    if( pNew==0 ) return 0;
    pCur->aPoint = pNew;
    pCur->nPointAlloc = nNew;
  }
  i = pCur->nPoint++;
  pNew = pCur->aPoint + i;
  pNew->rScore = rScore;
  pNew->iLevel = iLevel;
  assert( iLevel<=RTREE_MAX_DEPTH );
  while( i>0 ){
    RtreeSearchPoint *pParent;
    j = (i-1)/2;
    pParent = pCur->aPoint + j;
    if( rtreeSearchPointCompare(pNew, pParent)>=0 ) break;
    rtreeSearchPointSwap(pCur, j, i);
    i = j;
    pNew = pParent;
  }
  return pNew;
}